

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

_Bool upb_strtable_resize(upb_strtable *t,size_t size_lg2,upb_Arena *a)

{
  long *plVar1;
  uint uVar2;
  upb_tabent *puVar3;
  upb_value val;
  upb_key tabkey;
  int iVar4;
  uint32_t hash;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  lookupkey_t key;
  upb_strtable new_table;
  
  iVar4 = init((EVP_PKEY_CTX *)&new_table);
  if ((char)iVar4 == '\0') {
    return false;
  }
  uVar7 = 0xffffffffffffffff;
  do {
    uVar5 = (ulong)((t->t).mask + 1);
    lVar6 = uVar7 * 0x18 + 0x20;
    do {
      uVar7 = uVar7 + 1;
      if (uVar5 <= uVar7) {
        uVar7 = 0xfffffffffffffffe;
        break;
      }
      plVar1 = (long *)((long)&(((t->t).entries)->val).val + lVar6);
      lVar6 = lVar6 + 0x18;
    } while (*plVar1 == 0);
    if (uVar5 <= uVar7) {
      (t->t).entries = new_table.t.entries;
      (t->t).count = new_table.t.count;
      (t->t).mask = new_table.t.mask;
      return (_Bool)(char)iVar4;
    }
    puVar3 = (t->t).entries;
    val.val = puVar3[uVar7].val.val;
    tabkey = (upb_key)puVar3[uVar7].key.str;
    uVar2 = (tabkey.str)->size;
    if ((ulong)uVar2 != (ulong)(tabkey.str)->size) {
      __assert_fail("keystr->size == sv.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                    ,0x1eb,"_Bool upb_strtable_resize(upb_strtable *, size_t, upb_Arena *)");
    }
    hash = _upb_Hash((void *)(tabkey.num + 4),(ulong)uVar2,0x492128);
    key.str.size._0_4_ = uVar2;
    key.str.data = (char *)(tabkey.num + 4);
    key.str.size._4_4_ = 0;
    insert(&new_table.t,key,tabkey,val,hash,strhash,streql);
  } while( true );
}

Assistant:

bool upb_strtable_resize(upb_strtable* t, size_t size_lg2, upb_Arena* a) {
  upb_strtable new_table;
  if (!init(&new_table.t, size_lg2, a)) return false;

  intptr_t iter = UPB_STRTABLE_BEGIN;
  upb_StringView sv;
  upb_value val;
  while (upb_strtable_next2(t, &sv, &val, &iter)) {
    // Unlike normal insert, does not copy string data or possibly reallocate
    // the table
    // The data pointer used in the table is guaranteed to point at a
    // upb_SizePrefixString, we just need to back up by the size of the uint32_t
    // length prefix.
    const upb_SizePrefixString* keystr =
        (const upb_SizePrefixString*)(sv.data - sizeof(uint32_t));
    UPB_ASSERT(keystr->data == sv.data);
    UPB_ASSERT(keystr->size == sv.size);

    lookupkey_t lookupkey = {.str = sv};
    upb_key tabkey = {.str = keystr};
    uint32_t hash = _upb_Hash_NoSeed(sv.data, sv.size);
    insert(&new_table.t, lookupkey, tabkey, val, hash, &strhash, &streql);
  }
  *t = new_table;
  return true;
}